

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_test.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Unicode_TestUTF8_Test::~Unicode_TestUTF8_Test
          (Unicode_TestUTF8_Test *this)

{
  void *in_RDI;
  
  ~Unicode_TestUTF8_Test((Unicode_TestUTF8_Test *)0x161d78);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Unicode, TestUTF8)
{
    // ASCII encodes as itself.
    testEncodeDecode(0x00, std::string("\x00", 1));
    testEncodeDecode(0x41, "A");
    testEncodeDecode(0x7f, "\x7f");

    testEncodeDecode(0x80, "\xc2\x80");
    testEncodeDecode(0x100, "\xc4\x80");
    testEncodeDecode(0x7ff, "\xdf\xbf");

    testEncodeDecode(0x800, "\xe0\xa0\x80");
    testEncodeDecode(0x1482, "\xe1\x92\x82");
    testEncodeDecode(0xffff, "\xef\xbf\xbf");

    testEncodeDecode(0x010000, "\xf0\x90\x80\x80");
    testEncodeDecode(0x01f600, "\xf0\x9f\x98\x80"); // U+1F600 "Grinning Face"
    testEncodeDecode(0x0f057e, "\xf3\xb0\x95\xbe"); // U+F057E Private use area character
    testEncodeDecode(0x10ffff, "\xf4\x8f\xbf\xbf");
}